

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

void flatcc_builder_clear(flatcc_builder_t *B)

{
  flatcc_iovec_t *pfVar1;
  long lVar2;
  
  pfVar1 = B->buffers;
  lVar2 = 0;
  do {
    (*B->alloc)(B->alloc_context,pfVar1,0,0,(int)lVar2);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar2 != 8);
  if (B->is_default_emitter != 0) {
    flatcc_emitter_clear(&B->default_emit_context);
  }
  if (B->refmap != (flatcc_refmap_t *)0x0) {
    flatcc_refmap_clear(B->refmap);
  }
  memset(B,0,400);
  return;
}

Assistant:

void flatcc_builder_clear(flatcc_builder_t *B)
{
    iovec_t *buf;
    int i;

    for (i = 0; i < FLATCC_BUILDER_ALLOC_BUFFER_COUNT; ++i) {
        buf = B->buffers + i;
        B->alloc(B->alloc_context, buf, 0, 0, i);
    }
    if (B->is_default_emitter) {
        flatcc_emitter_clear(&B->default_emit_context);
    }
    if (B->refmap) {
        flatcc_refmap_clear(B->refmap);
    }
    memset(B, 0, sizeof(*B));
}